

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_vector.h
# Opt level: O2

void __thiscall lzham::symbol_codec::arith_propagate_carry(symbol_codec *this)

{
  uchar *puVar1;
  uint uVar2;
  uint uVar3;
  
  uVar2 = (this->m_arith_output_buf).m_size;
  while( true ) {
    uVar2 = uVar2 - 1;
    if ((int)uVar2 < 0) {
      return;
    }
    puVar1 = (this->m_arith_output_buf).m_p;
    uVar3 = uVar2 & 0x7fffffff;
    if (puVar1[uVar3] != 0xff) break;
    puVar1[uVar3] = '\0';
  }
  puVar1[uVar3] = puVar1[uVar3] + '\x01';
  return;
}

Assistant:

inline uint size() const { return m_size; }